

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

boolean start_timer(level *lev,long when,short kind,short func_index,void *arg)

{
  uint uVar1;
  timer_element *gnu_00;
  timer_element *gnu;
  void *arg_local;
  short func_index_local;
  short kind_local;
  long when_local;
  level *lev_local;
  
  if ((-1 < func_index) && (func_index < 6)) {
    gnu_00 = (timer_element *)malloc(0x20);
    memset(gnu_00,0,0x20);
    gnu_00->next = (timer_element *)0x0;
    uVar1 = timer_id + 1;
    gnu_00->tid = timer_id;
    timer_id = uVar1;
    gnu_00->timeout = moves + (int)when;
    gnu_00->kind = kind;
    gnu_00->field_0x1b = gnu_00->field_0x1b & 0xfe;
    gnu_00->func_index = (uchar)func_index;
    gnu_00->arg = arg;
    insert_timer(lev,gnu_00);
    if (kind == 2) {
      *(char *)((long)arg + 0x49) = *(char *)((long)arg + 0x49) + '\x01';
    }
    return '\x01';
  }
  panic("start_timer");
}

Assistant:

boolean start_timer(struct level *lev, long when, short kind, short func_index,void *arg)
{
    timer_element *gnu;

    if (func_index < 0 || func_index >= NUM_TIME_FUNCS)
	panic("start_timer");

    gnu = malloc(sizeof(timer_element));
    memset(gnu, 0, sizeof(timer_element));
    gnu->next = NULL;
    gnu->tid = timer_id++;
    gnu->timeout = moves + when;
    gnu->kind = kind;
    gnu->needs_fixup = FALSE;
    gnu->func_index = func_index;
    gnu->arg = arg;
    insert_timer(lev, gnu);

    if (kind == TIMER_OBJECT)	/* increment object's timed count */
	((struct obj *)arg)->timed++;

    /* should check for duplicates and fail if any */
    return TRUE;
}